

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

Image * __thiscall
phosg::BitmapImage::to_color
          (Image *__return_storage_ptr__,BitmapImage *this,uint32_t false_color,uint32_t true_color,
          bool add_alpha)

{
  ulong uVar1;
  unsigned_long *puVar2;
  uint32_t local_a4;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  size_t z;
  ulong uStack_38;
  uint8_t pending_bits;
  size_t x;
  size_t y;
  uint32_t local_20;
  uint32_t uStack_1c;
  bool add_alpha_local;
  uint32_t true_color_local;
  uint32_t false_color_local;
  BitmapImage *this_local;
  Image *ret;
  
  y._6_1_ = 0;
  y._7_1_ = add_alpha;
  local_20 = true_color;
  uStack_1c = false_color;
  _true_color_local = this;
  this_local = (BitmapImage *)__return_storage_ptr__;
  Image::Image(__return_storage_ptr__,this->width,this->height,add_alpha,'\b');
  for (x = 0; x < this->height; x = x + 1) {
    for (uStack_38 = 0; uStack_38 < this->width; uStack_38 = uStack_38 + 8) {
      z._7_1_ = this->data[x * this->row_bytes + (uStack_38 >> 3)];
      local_48 = 0;
      while( true ) {
        uVar1 = local_48;
        local_50 = this->width - uStack_38;
        local_58 = 8;
        puVar2 = ::std::min<unsigned_long>(&local_50,&local_58);
        if (*puVar2 <= uVar1) break;
        if ((z._7_1_ & 0x80) == 0) {
          local_a4 = uStack_1c;
        }
        else {
          local_a4 = local_20;
        }
        Image::write_pixel(__return_storage_ptr__,uStack_38 + local_48,x,local_a4);
        z._7_1_ = z._7_1_ << 1;
        local_48 = local_48 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image BitmapImage::to_color(uint32_t false_color, uint32_t true_color, bool add_alpha) const {
  Image ret(this->width, this->height, add_alpha);
  for (size_t y = 0; y < this->height; y++) {
    for (size_t x = 0; x < this->width; x += 8) {
      uint8_t pending_bits = this->data[(y * this->row_bytes) + (x >> 3)];
      for (size_t z = 0; z < std::min<size_t>(this->width - x, 8); z++) {
        ret.write_pixel(x + z, y, (pending_bits & 0x80) ? true_color : false_color);
        pending_bits <<= 1;
      }
    }
  }
  return ret;
}